

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
               (AffixPatternProvider *patternInfo,bool isPrefix,int8_t signum,
               UNumberSignDisplay signDisplay,Form plural,bool perMilleReplacesPercent,
               UnicodeString *output)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  char16_t local_32;
  uint local_30;
  char16_t candidate;
  int index;
  int length;
  bool prependSign;
  int flags;
  bool useNegativeAffixPattern;
  bool plusReplacesMinusSign;
  bool perMilleReplacesPercent_local;
  Form plural_local;
  UNumberSignDisplay signDisplay_local;
  int8_t signum_local;
  bool isPrefix_local;
  AffixPatternProvider *patternInfo_local;
  
  local_33 = false;
  if ((signum != -1) &&
     (((signDisplay == UNUM_SIGN_ALWAYS || (signDisplay == UNUM_SIGN_ACCOUNTING_ALWAYS)) ||
      ((local_33 = false, signum == '\x01' &&
       ((signDisplay == UNUM_SIGN_EXCEPT_ZERO ||
        (local_33 = false, signDisplay == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO)))))))) {
    uVar1 = (*patternInfo->_vptr_AffixPatternProvider[6])();
    local_33 = (uVar1 & 1) == 0;
  }
  uVar1 = (*patternInfo->_vptr_AffixPatternProvider[7])();
  local_34 = false;
  if ((uVar1 & 1) != 0) {
    local_35 = true;
    if (signum != -1) {
      uVar1 = (*patternInfo->_vptr_AffixPatternProvider[8])();
      local_36 = false;
      if ((uVar1 & 1) != 0) {
        local_36 = local_33;
      }
      local_35 = local_36;
    }
    local_34 = local_35;
  }
  length = 0;
  if (local_34 != false) {
    length = 0x200;
  }
  if (isPrefix) {
    length = length | 0x100;
  }
  if (plural != COUNT) {
    length = plural | length;
  }
  if ((isPrefix) && (local_34 == false)) {
    if (signum == -1) {
      index._3_1_ = signDisplay != UNUM_SIGN_NEVER;
    }
    else {
      index._3_1_ = local_33;
    }
  }
  else {
    index._3_1_ = false;
  }
  uVar4 = (ulong)(uint)length;
  iVar2 = (*patternInfo->_vptr_AffixPatternProvider[3])(patternInfo,uVar4);
  UnicodeString::remove(output,(char *)CONCAT71((int7)(uVar4 >> 8),index._3_1_));
  for (local_30 = 0; (int)local_30 < (int)(iVar2 + (uint)(index._3_1_ != false));
      local_30 = local_30 + 1) {
    if ((index._3_1_ == false) || (local_30 != 0)) {
      if (index._3_1_ == false) {
        iVar3 = (*patternInfo->_vptr_AffixPatternProvider[2])
                          (patternInfo,(ulong)(uint)length,(ulong)local_30);
        local_32 = (char16_t)iVar3;
      }
      else {
        iVar3 = (*patternInfo->_vptr_AffixPatternProvider[2])
                          (patternInfo,(ulong)(uint)length,(ulong)(local_30 - 1));
        local_32 = (char16_t)iVar3;
      }
    }
    else {
      local_32 = L'-';
    }
    if ((local_33 != false) && (local_32 == L'-')) {
      local_32 = L'+';
    }
    if ((perMilleReplacesPercent) && (local_32 == L'%')) {
      local_32 = L'‰';
    }
    UnicodeString::append(output,local_32);
  }
  return;
}

Assistant:

void PatternStringUtils::patternInfoToStringBuilder(const AffixPatternProvider& patternInfo, bool isPrefix,
                                                    int8_t signum, UNumberSignDisplay signDisplay,
                                                    StandardPlural::Form plural,
                                                    bool perMilleReplacesPercent, UnicodeString& output) {

    // Should the output render '+' where '-' would normally appear in the pattern?
    bool plusReplacesMinusSign = signum != -1 && (
            signDisplay == UNUM_SIGN_ALWAYS || signDisplay == UNUM_SIGN_ACCOUNTING_ALWAYS || (
                    signum == 1 && (
                            signDisplay == UNUM_SIGN_EXCEPT_ZERO ||
                            signDisplay == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO))) &&
                                 patternInfo.positiveHasPlusSign() == false;

    // Should we use the affix from the negative subpattern? (If not, we will use the positive
    // subpattern.)
    bool useNegativeAffixPattern = patternInfo.hasNegativeSubpattern() && (
            signum == -1 || (patternInfo.negativeHasMinusSign() && plusReplacesMinusSign));

    // Resolve the flags for the affix pattern.
    int flags = 0;
    if (useNegativeAffixPattern) {
        flags |= AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN;
    }
    if (isPrefix) {
        flags |= AffixPatternProvider::AFFIX_PREFIX;
    }
    if (plural != StandardPlural::Form::COUNT) {
        U_ASSERT(plural == (AffixPatternProvider::AFFIX_PLURAL_MASK & plural));
        flags |= plural;
    }

    // Should we prepend a sign to the pattern?
    bool prependSign;
    if (!isPrefix || useNegativeAffixPattern) {
        prependSign = false;
    } else if (signum == -1) {
        prependSign = signDisplay != UNUM_SIGN_NEVER;
    } else {
        prependSign = plusReplacesMinusSign;
    }

    // Compute the length of the affix pattern.
    int length = patternInfo.length(flags) + (prependSign ? 1 : 0);

    // Finally, set the result into the StringBuilder.
    output.remove();
    for (int index = 0; index < length; index++) {
        char16_t candidate;
        if (prependSign && index == 0) {
            candidate = u'-';
        } else if (prependSign) {
            candidate = patternInfo.charAt(flags, index - 1);
        } else {
            candidate = patternInfo.charAt(flags, index);
        }
        if (plusReplacesMinusSign && candidate == u'-') {
            candidate = u'+';
        }
        if (perMilleReplacesPercent && candidate == u'%') {
            candidate = u'‰';
        }
        output.append(candidate);
    }
}